

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_bool32 drwav__on_seek_memory(void *pUserData,int offset,drwav_seek_origin origin)

{
  ulong uVar1;
  drwav__memory_stream *memory;
  
  if (pUserData != (void *)0x0) {
    if (origin == drwav_seek_origin_current) {
      uVar1 = *(ulong *)((long)pUserData + 0x10);
      if (offset < 1) {
        if (uVar1 < (uint)-offset) {
          offset = -(int)uVar1;
        }
      }
      else if (*(ulong *)((long)pUserData + 8) < (uint)offset + uVar1) {
        offset = (int)*(ulong *)((long)pUserData + 8) - (int)uVar1;
      }
      uVar1 = uVar1 + (long)offset;
    }
    else {
      uVar1 = *(ulong *)((long)pUserData + 8);
      if ((uint)offset <= uVar1) {
        uVar1 = (ulong)offset;
      }
    }
    *(ulong *)((long)pUserData + 0x10) = uVar1;
    return 1;
  }
  __assert_fail("memory != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/dr_wav.h"
                ,0x45c,"drwav_bool32 drwav__on_seek_memory(void *, int, drwav_seek_origin)");
}

Assistant:

static drwav_bool32 drwav__on_seek_memory(void* pUserData, int offset, drwav_seek_origin origin) {
    drwav__memory_stream* memory = (drwav__memory_stream*)pUserData;
    drwav_assert(memory != NULL);

    if (origin == drwav_seek_origin_current) {
        if (offset > 0) {
            if (memory->currentReadPos + offset > memory->dataSize) {
                offset = (int)(memory->dataSize - memory->currentReadPos);  // Trying to seek too far forward.
            }
        } else {
            if (memory->currentReadPos < (size_t)-offset) {
                offset = -(int)memory->currentReadPos;  // Trying to seek too far backwards.
            }
        }

        // This will never underflow thanks to the clamps above.
        memory->currentReadPos += offset;
    } else {
        if ((drwav_uint32)offset <= memory->dataSize) {
            memory->currentReadPos = offset;
        } else {
            memory->currentReadPos = memory->dataSize;  // Trying to seek too far forward.
        }
    }

    return DRWAV_TRUE;
}